

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O3

void fiobj_dealloc_task(FIOBJ o,void *stack_)

{
  undefined1 uVar1;
  fiobj_object_vtable_s *pfVar2;
  uintptr_t uVar3;
  void *pvVar4;
  int *piVar5;
  ulong uVar6;
  undefined1 *puVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar8 = (uint)o & 6;
  if (uVar8 == 6) {
    return;
  }
  if (o == 0) {
    return;
  }
  if ((o & 1) != 0) {
    return;
  }
  puVar7 = (undefined1 *)(o & 0xfffffffffffffff8);
  LOCK();
  piVar5 = (int *)(puVar7 + 4);
  *piVar5 = *piVar5 + -1;
  UNLOCK();
  if (*piVar5 != 0) {
    return;
  }
  if ((o & 6) == 0) {
    switch(*puVar7) {
    case 0x27:
      pfVar2 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      goto switchD_00145d28_caseD_28;
    case 0x29:
      pfVar2 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      goto switchD_00145d28_caseD_2a;
    case 0x2b:
      pfVar2 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar2 = &FIOBJECT_VTABLE_NUMBER;
    }
  }
  else if (uVar8 == 2) {
switchD_00145d28_caseD_28:
    pfVar2 = &FIOBJECT_VTABLE_STRING;
  }
  else {
switchD_00145d28_caseD_2a:
    pfVar2 = &FIOBJECT_VTABLE_HASH;
  }
  if (pfVar2->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0) {
    if ((o & 6) == 0) {
      switch(*puVar7) {
      case 0x27:
        pfVar2 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case 0x28:
        goto switchD_00145d78_caseD_28;
      case 0x29:
        pfVar2 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case 0x2a:
        goto switchD_00145d78_caseD_2a;
      case 0x2b:
        pfVar2 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar2 = &FIOBJECT_VTABLE_NUMBER;
      }
    }
    else if (uVar8 == 2) {
switchD_00145d78_caseD_28:
      pfVar2 = &FIOBJECT_VTABLE_STRING;
    }
    else {
switchD_00145d78_caseD_2a:
      pfVar2 = &FIOBJECT_VTABLE_HASH;
    }
    uVar3 = (*pfVar2->count)(o);
    if (uVar3 != 0) {
      if (stack_ != (void *)0x0) {
        uVar6 = *(ulong *)((long)stack_ + 8);
        if ((*(ulong *)((long)stack_ + 0x10) <= uVar6) &&
           (*(ulong *)((long)stack_ + 0x10) <= uVar6 + 5)) {
          uVar9 = uVar6 + 5 & 0xfffffffffffffffe;
          pvVar4 = fio_realloc2(*(void **)((long)stack_ + 0x18),uVar9 * 8 + 0x10,uVar6 << 3);
          *(void **)((long)stack_ + 0x18) = pvVar4;
          if (pvVar4 == (void *)0x0) {
            if (0 < FIO_LOG_LEVEL) {
              FIO_LOG2STDERR(
                            "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4920"
                            );
            }
            kill(0,2);
            piVar5 = __errno_location();
            exit(*piVar5);
          }
          *(ulong *)((long)stack_ + 0x10) = uVar9 + 2;
          uVar6 = *(ulong *)((long)stack_ + 8);
        }
        if (*stack_ == uVar6) {
          *(undefined8 *)stack_ = 0;
          *(undefined8 *)((long)stack_ + 8) = 0;
          uVar6 = 0;
        }
        *(FIOBJ *)(*(long *)((long)stack_ + 0x18) + uVar6 * 8) = o;
        *(long *)((long)stack_ + 8) = *(long *)((long)stack_ + 8) + 1;
      }
      return;
    }
  }
  switch(uVar8) {
  case 0:
    uVar1 = *puVar7;
    break;
  case 2:
    goto switchD_00145e16_caseD_2;
  case 4:
    goto switchD_00145e16_caseD_4;
  case 6:
    uVar1 = (undefined1)o;
  }
  switch(uVar1) {
  case 0x27:
    pfVar2 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case 0x28:
switchD_00145e16_caseD_2:
    pfVar2 = &FIOBJECT_VTABLE_STRING;
    break;
  case 0x29:
    pfVar2 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case 0x2a:
switchD_00145e16_caseD_4:
    pfVar2 = &FIOBJECT_VTABLE_HASH;
    break;
  case 0x2b:
    pfVar2 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    pfVar2 = &FIOBJECT_VTABLE_NUMBER;
  }
  (*pfVar2->dealloc)(o,(_func_void_FIOBJ_void_ptr *)0x0,(void *)0x0);
  return;
}

Assistant:

static void fiobj_dealloc_task(FIOBJ o, void *stack_) {
  // if (!o)
  //   fprintf(stderr, "* WARN: freeing a NULL no-object\n");
  // else
  //   fprintf(stderr, "* freeing object %s\n", fiobj_obj2cstr(o).data);
  if (!o || !FIOBJ_IS_ALLOCATED(o))
    return;
  if (OBJREF_REM(o))
    return;
  if (!FIOBJECT2VTBL(o)->each || !FIOBJECT2VTBL(o)->count(o)) {
    FIOBJECT2VTBL(o)->dealloc(o, NULL, NULL);
    return;
  }
  fiobj_stack_s *s = stack_;
  fiobj_stack_push(s, o);
}